

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::EliminateDeadMembersPass::GetNewMemberIndex
          (EliminateDeadMembersPass *this,uint32_t type_id,uint32_t member_idx)

{
  bool bVar1;
  pointer ppVar2;
  iterator __first;
  difference_type dVar3;
  _Self local_40;
  _Self local_38;
  iterator current_member;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
  local_28;
  iterator live_members;
  uint32_t member_idx_local;
  uint32_t type_id_local;
  EliminateDeadMembersPass *this_local;
  
  live_members.
  super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
  ._M_cur._0_4_ = member_idx;
  live_members.
  super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
  ._M_cur._4_4_ = type_id;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
       ::find(&this->used_members_,
              (key_type *)
              ((long)&live_members.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                      ._M_cur + 4));
  current_member._M_node =
       (_Base_ptr)
       std::
       unordered_map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
       ::end(&this->used_members_);
  bVar1 = std::__detail::operator==
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                      *)&current_member);
  if (bVar1) {
    this_local._4_4_ =
         (uint32_t)
         live_members.
         super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
         ._M_cur;
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false,_false>
                           *)&local_28);
    local_38._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                   (&ppVar2->second,(key_type_conflict *)&live_members);
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false,_false>
                           *)&local_28);
    local_40._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                   (&ppVar2->second);
    bVar1 = std::operator==(&local_38,&local_40);
    if (bVar1) {
      this_local._4_4_ = 0xffffffff;
    }
    else {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false,_false>
                             *)&local_28);
      __first = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                begin(&ppVar2->second);
      dVar3 = std::distance<std::_Rb_tree_const_iterator<unsigned_int>>
                        ((_Rb_tree_const_iterator<unsigned_int>)__first._M_node,
                         (_Rb_tree_const_iterator<unsigned_int>)local_38._M_node);
      this_local._4_4_ = (uint32_t)dVar3;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t EliminateDeadMembersPass::GetNewMemberIndex(uint32_t type_id,
                                                     uint32_t member_idx) {
  auto live_members = used_members_.find(type_id);
  if (live_members == used_members_.end()) {
    return member_idx;
  }

  auto current_member = live_members->second.find(member_idx);
  if (current_member == live_members->second.end()) {
    return kRemovedMember;
  }

  return static_cast<uint32_t>(
      std::distance(live_members->second.begin(), current_member));
}